

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O2

int luaD_poscall(lua_State *L,StkId firstResult)

{
  int *piVar1;
  int iVar2;
  CallInfo *pCVar3;
  StkId pTVar4;
  int iVar5;
  TValue *o2;
  
  if ((L->hookmask & 2) != 0) {
    pTVar4 = L->stack;
    luaD_callhook(L,1,-1);
    if ((((L->ci->func->value).gc)->h).flags == '\0') {
      while ((L->hookmask & 2) != 0) {
        piVar1 = &L->ci->tailcalls;
        iVar2 = *piVar1;
        *piVar1 = *piVar1 + -1;
        if (iVar2 == 0) break;
        luaD_callhook(L,4,-1);
      }
    }
    firstResult = (StkId)(((long)firstResult - (long)pTVar4) + (long)L->stack);
  }
  pCVar3 = L->ci;
  L->ci = pCVar3 + -1;
  pTVar4 = pCVar3->func;
  iVar2 = pCVar3->nresults;
  L->base = pCVar3[-1].base;
  L->savedpc = pCVar3[-1].savedpc;
  iVar5 = iVar2;
  for (; (iVar5 != 0 && (firstResult < L->top)); firstResult = firstResult + 1) {
    pTVar4->value = firstResult->value;
    pTVar4->tt = firstResult->tt;
    pTVar4 = pTVar4 + 1;
    iVar5 = iVar5 + -1;
  }
  for (; 0 < iVar5; iVar5 = iVar5 + -1) {
    pTVar4->tt = 0;
    pTVar4 = pTVar4 + 1;
  }
  L->top = pTVar4;
  return iVar2 + 1;
}

Assistant:

int luaD_poscall (lua_State *L, StkId firstResult) {
  StkId res;
  int wanted, i;
  CallInfo *ci;
  if (L->hookmask & LUA_MASKRET)
    firstResult = callrethooks(L, firstResult);
  ci = L->ci--;
  res = ci->func;  /* res == final position of 1st result */
  wanted = ci->nresults;
  L->base = (ci - 1)->base;  /* restore base */
  L->savedpc = (ci - 1)->savedpc;  /* restore savedpc */
  /* move results to correct place */
  for (i = wanted; i != 0 && firstResult < L->top; i--)
    setobjs2s(L, res++, firstResult++);
  while (i-- > 0)
    setnilvalue(res++);
  L->top = res;
  return (wanted - LUA_MULTRET);  /* 0 iff wanted == LUA_MULTRET */
}